

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O2

void __thiscall ki::dml::Record::from_xml(Record *this,xml_node<char> *node)

{
  mapped_type pFVar1;
  bool bVar2;
  FieldBase *this_00;
  mapped_type *ppFVar3;
  __normal_iterator<ki::dml::FieldBase_**,_std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>_>
  _Var4;
  xml_node<char> *node_00;
  ostream *poVar5;
  value_error *this_01;
  char *pcVar6;
  FieldBase *old_field;
  string local_208;
  string node_name;
  string local_1c8;
  ostringstream oss;
  
  pcVar6 = (node->super_xml_base<char>).m_name;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = &rapidxml::xml_base<char>::nullstr()::zero;
  }
  std::__cxx11::string::string((string *)&node_name,pcVar6,(allocator *)&oss);
  bVar2 = std::operator!=(&node_name,"RECORD");
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Expected <RECORD> node but got <");
    pcVar6 = (node->super_xml_base<char>).m_name;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5,">.");
    this_01 = (value_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    value_error::value_error(this_01,&local_208);
    __cxa_throw(this_01,&value_error::typeinfo,std::runtime_error::~runtime_error);
  }
  node_00 = node->m_first_node;
  do {
    if (node_00 == (xml_node<char> *)0x0) {
      std::__cxx11::string::~string((string *)&node_name);
      return;
    }
    if (node_00->m_type == node_element) {
      this_00 = FieldBase::create_from_xml(node_00);
      FieldBase::get_name_abi_cxx11_(&local_1c8,this_00);
      bVar2 = has_field(this,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      if (bVar2) {
        FieldBase::get_name_abi_cxx11_((string *)&oss,this_00);
        ppFVar3 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
                  ::at(&this->m_field_map,(string *)&oss);
        pFVar1 = *ppFVar3;
        std::__cxx11::string::~string((string *)&oss);
        old_field = pFVar1;
        if (this_00->m_type_hash == pFVar1->m_type_hash) {
          (*(pFVar1->super_Serializable)._vptr_Serializable[0xb])(pFVar1);
        }
        else {
          _Var4 = std::
                  __find_if<__gnu_cxx::__normal_iterator<ki::dml::FieldBase**,std::vector<ki::dml::FieldBase*,std::allocator<ki::dml::FieldBase*>>>,__gnu_cxx::__ops::_Iter_equals_val<ki::dml::FieldBase*const>>
                            ((this->m_fields).
                             super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (this->m_fields).
                             super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&old_field);
          *_Var4._M_current = this_00;
          FieldBase::get_name_abi_cxx11_((string *)&oss,this_00);
          ppFVar3 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
                    ::operator[](&this->m_field_map,(string *)&oss);
          *ppFVar3 = this_00;
          std::__cxx11::string::~string((string *)&oss);
          this_00 = old_field;
          if (old_field == (FieldBase *)0x0) goto LAB_0013b60a;
        }
        (*(this_00->super_Serializable)._vptr_Serializable[4])(this_00);
      }
      else {
        add_field(this,this_00);
      }
    }
LAB_0013b60a:
    node_00 = rapidxml::xml_node<char>::next_sibling(node_00,(char *)0x0,0,true);
  } while( true );
}

Assistant:

void Record::from_xml(rapidxml::xml_node<> *node)
	{
		// Make sure that we've been passed a <RECORD> element.
		const std::string node_name = node->name();
		if (node_name != "RECORD")
		{
			std::ostringstream oss;
			oss << "Expected <RECORD> node but got <" << node->name() << ">.";
			throw value_error(oss.str());
		}

		// Every child node inside a <RECORD> element is a Field.
		for (auto *field_node = node->first_node();
			field_node; field_node = field_node->next_sibling())
		{
			if (field_node->type() != rapidxml::node_type::node_element)
				continue;

			FieldBase *field = FieldBase::create_from_xml(field_node);
			if (has_field(field->get_name()))
			{
				// Is the old field the same type as the one created from
				// the XML data?
				FieldBase *old_field = m_field_map.at(field->get_name());
				if (field->m_type_hash == old_field->m_type_hash)
				{
					// Set the value of the old field to the value of the new
					// one.
					old_field->set_value(field);
					delete field;
				}
				else
				{
					// Since the types are different, we can't set the value
					// of the old field to the value of the new one so,
					// replace the old field with this new one instead.
					const std::ptrdiff_t index = std::find(
						m_fields.begin(), m_fields.end(), old_field) - m_fields.begin();
					m_fields[index] = field;
					m_field_map[field->get_name()] = field;
					delete old_field;
				}
			}
			else
				add_field(field);
		}
	}